

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl3raster.cpp
# Opt level: O0

uint32 __thiscall rw::gl3::getLevelSize(gl3 *this,Raster *raster,int32 level)

{
  int local_2c;
  int minDim;
  int s;
  int h;
  int w;
  Gl3Raster *natras;
  int i;
  int32 level_local;
  Raster *raster_local;
  
  s = *(int *)(this + 0x40);
  minDim = *(int *)(this + 0x44);
  local_2c = *(int *)(this + 0x48);
  for (natras._0_4_ = 0; (int)natras < (int)raster; natras._0_4_ = (int)natras + 1) {
    if (1 < s) {
      s = s / 2;
      local_2c = local_2c / 2;
    }
    if (1 < minDim) {
      minDim = minDim / 2;
    }
  }
  return local_2c * minDim;
}

Assistant:

static uint32
getLevelSize(Raster *raster, int32 level)
{
	int i;
	Gl3Raster *natras = GETGL3RASTEREXT(raster);

	int w = raster->originalWidth;
	int h = raster->originalHeight;
	int s = raster->originalStride;
	int minDim = 1;

#ifdef RW_OPENGL
	switch(natras->internalFormat){
	case GL_COMPRESSED_RGBA_S3TC_DXT1_EXT:
	case GL_COMPRESSED_RGB_S3TC_DXT1_EXT:
	case GL_COMPRESSED_RGBA_S3TC_DXT3_EXT:
	case GL_COMPRESSED_RGBA_S3TC_DXT5_EXT:
		minDim = 4;
		break;
	}
#endif

	for(i = 0; i < level; i++){
		if(w > minDim){
			w /= 2;
			s /= 2;
		}
		if(h > minDim)
			h /= 2;
	}

	return s*h;
}